

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O0

int __thiscall cmCPackSTGZGenerator::GenerateHeader(cmCPackSTGZGenerator *this,ostream *os)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  void *this_00;
  char local_d28 [8];
  char buffer [1024];
  string local_920 [32];
  undefined1 local_900 [8];
  ostringstream cmCPackLog_msg_1;
  char *local_788;
  char *ptr;
  string res;
  string local_740 [8];
  string packageHeaderText;
  ifstream ifs;
  allocator<char> local_511;
  string local_510;
  cmValue local_4f0;
  string local_4e8 [8];
  string inFile;
  char headerLengthTag [26];
  allocator<char> local_4a1;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_460 [8];
  string licenseText;
  ifstream ilfs;
  undefined1 local_238 [8];
  string line;
  string local_210;
  cmValue local_1f0;
  string local_1e8 [8];
  string inLicFile;
  string local_1c0 [4];
  int counter;
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  ostream *os_local;
  cmCPackSTGZGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"Writing header");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x48,pcVar5);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  inLicFile.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"CPACK_RESOURCE_FILE_LICENSE",
             (allocator<char> *)(line.field_2._M_local_buf + 0xf));
  local_1f0 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,&local_210);
  psVar6 = cmValue::operator_cast_to_string_(&local_1f0);
  std::__cxx11::string::string(local_1e8,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)(line.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_238);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&licenseText.field_2 + 8),pcVar5,_S_in);
  std::__cxx11::string::string((string *)local_460);
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)((long)&licenseText.field_2 + 8),(string *)local_238,(bool *)0x0,
                       0xffffffffffffffff);
    if (!bVar2) break;
    std::operator+(&local_480,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   "\n");
    std::__cxx11::string::operator+=((string *)local_460,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"CPACK_RESOURCE_FILE_LICENSE_CONTENT",&local_4a1);
  cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,&local_4a0,(string *)local_460);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  inFile.field_2._8_1_ = '#';
  inFile.field_2._9_1_ = '#';
  inFile.field_2._10_1_ = '#';
  inFile.field_2._11_1_ = 'C';
  inFile.field_2._12_1_ = 'P';
  inFile.field_2._13_1_ = 'A';
  inFile.field_2._14_1_ = 'C';
  inFile.field_2._15_1_ = 'K';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"CPACK_STGZ_HEADER_FILE",&local_511);
  local_4f0 = cmCPackGenerator::GetOption((cmCPackGenerator *)this,&local_510);
  psVar6 = cmValue::operator_cast_to_string_(&local_4f0);
  std::__cxx11::string::string(local_4e8,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&packageHeaderText.field_2 + 8),pcVar5,_S_in);
  std::__cxx11::string::string(local_740);
  while( true ) {
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)((long)&packageHeaderText.field_2 + 8),(string *)local_238,
                       (bool *)0x0,0xffffffffffffffff);
    if (!bVar2) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&res.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   "\n");
    std::__cxx11::string::operator+=(local_740,(string *)(res.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(res.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&ptr);
  (*(this->super_cmCPackArchiveGenerator).super_cmCPackGenerator._vptr_cmCPackGenerator[0xd])
            (this,local_740,(string *)&ptr);
  for (local_788 = (char *)std::__cxx11::string::c_str(); *local_788 != '\0';
      local_788 = local_788 + 1) {
    if (*local_788 == '\n') {
      inLicFile.field_2._12_4_ = inLicFile.field_2._12_4_ + 1;
    }
  }
  inLicFile.field_2._12_4_ = inLicFile.field_2._12_4_ + 1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
  poVar4 = std::operator<<((ostream *)local_900,"Number of lines: ");
  this_00 = (void *)std::ostream::operator<<(poVar4,inLicFile.field_2._12_4_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                  ,0x6c,pcVar5);
  std::__cxx11::string::~string(local_920);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
  snprintf(local_d28,0x400,"%d",(ulong)(uint)inLicFile.field_2._12_4_);
  cmsys::SystemTools::ReplaceString((string *)&ptr,inFile.field_2._M_local_buf + 8,local_d28);
  std::operator<<(os,(string *)&ptr);
  iVar3 = cmCPackArchiveGenerator::GenerateHeader(&this->super_cmCPackArchiveGenerator,os);
  std::__cxx11::string::~string((string *)&ptr);
  std::__cxx11::string::~string(local_740);
  std::ifstream::~ifstream((void *)((long)&packageHeaderText.field_2 + 8));
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string((string *)local_460);
  std::ifstream::~ifstream((void *)((long)&licenseText.field_2 + 8));
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string(local_1e8);
  return iVar3;
}

Assistant:

int cmCPackSTGZGenerator::GenerateHeader(std::ostream* os)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Writing header" << std::endl);
  int counter = 0;

  std::string inLicFile = this->GetOption("CPACK_RESOURCE_FILE_LICENSE");
  std::string line;
  cmsys::ifstream ilfs(inLicFile.c_str());
  std::string licenseText;
  while (cmSystemTools::GetLineFromStream(ilfs, line)) {
    licenseText += line + "\n";
  }
  this->SetOptionIfNotSet("CPACK_RESOURCE_FILE_LICENSE_CONTENT", licenseText);

  const char headerLengthTag[] = "###CPACK_HEADER_LENGTH###";

  // Create the header
  std::string inFile = this->GetOption("CPACK_STGZ_HEADER_FILE");
  cmsys::ifstream ifs(inFile.c_str());
  std::string packageHeaderText;
  while (cmSystemTools::GetLineFromStream(ifs, line)) {
    packageHeaderText += line + "\n";
  }

  // Configure in the values
  std::string res;
  this->ConfigureString(packageHeaderText, res);

  // Count the lines
  const char* ptr = res.c_str();
  while (*ptr) {
    if (*ptr == '\n') {
      counter++;
    }
    ++ptr;
  }
  counter++;
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Number of lines: " << counter << std::endl);
  char buffer[1024];
  snprintf(buffer, sizeof(buffer), "%d", counter);
  cmSystemTools::ReplaceString(res, headerLengthTag, buffer);

  // Write in file
  *os << res;
  return this->Superclass::GenerateHeader(os);
}